

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::FieldOptions::Clear(FieldOptions *this)

{
  void **ppvVar1;
  Rep *pRVar2;
  long lVar3;
  long lVar4;
  
  internal::ExtensionSet::Clear(&this->_extensions_);
  lVar4 = (long)(this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar4) {
    pRVar2 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
    lVar3 = 0;
    do {
      ppvVar1 = pRVar2->elements + lVar3;
      lVar3 = lVar3 + 1;
      UninterpretedOption::Clear((UninterpretedOption *)*ppvVar1);
    } while (lVar4 != lVar3);
    (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = 0;
  }
  if (((this->_has_bits_).has_bits_[0] & 0x3f) != 0) {
    this->jstype_ = 0;
    this->ctype_ = 0;
    this->packed_ = false;
    this->lazy_ = false;
    this->deprecated_ = false;
    this->weak_ = false;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

void FieldOptions::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.FieldOptions)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _extensions_.Clear();
  uninterpreted_option_.Clear();
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x0000003fu) {
    ::memset(&ctype_, 0, static_cast<size_t>(
        reinterpret_cast<char*>(&jstype_) -
        reinterpret_cast<char*>(&ctype_)) + sizeof(jstype_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}